

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.cpp
# Opt level: O0

Reals __thiscall
Omega_h::measure_edges_metric_tmpl<3,3>(Omega_h *this,Mesh *mesh,LOs *a2e,Reals *metrics)

{
  LO size_in;
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_138;
  undefined1 local_128 [8];
  type f;
  string local_d0 [32];
  undefined1 local_b0 [8];
  Write<double> lengths;
  undefined1 local_98 [4];
  LO na;
  LOs ev2v;
  MetricEdgeLengths<3,_3> measurer;
  Reals *metrics_local;
  LOs *a2e_local;
  Mesh *mesh_local;
  pointer local_10;
  
  measurer.metrics.write_.shared_alloc_.direct_ptr = metrics;
  Read<double>::Read((Read<double> *)&stack0xffffffffffffff88,metrics);
  MetricEdgeLengths<3,_3>::MetricEdgeLengths
            ((MetricEdgeLengths<3,_3> *)&stack0xffffffffffffff98,mesh,
             (Read<double> *)&stack0xffffffffffffff88);
  Read<double>::~Read((Read<double> *)&stack0xffffffffffffff88);
  Mesh::ask_verts_of((Mesh *)local_98,(Int)mesh);
  if (((ulong)(a2e->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = (pointer)((a2e->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (pointer)((ulong)(a2e->write_).shared_alloc_.alloc >> 3);
  }
  size_in = (LO)((ulong)local_10 >> 2);
  lengths.shared_alloc_.direct_ptr._4_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d0,"",
             (allocator *)((long)&f.measurer.metrics.write_.shared_alloc_.direct_ptr + 7));
  Write<double>::Write((Write<double> *)local_b0,size_in,(string *)local_d0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&f.measurer.metrics.write_.shared_alloc_.direct_ptr + 7));
  Read<int>::Read((Read<int> *)local_128,a2e);
  Read<int>::Read((Read<int> *)&f.a2e.write_.shared_alloc_.direct_ptr,(Read<int> *)local_98);
  Write<double>::Write
            ((Write<double> *)&f.ev2v.write_.shared_alloc_.direct_ptr,(Write<double> *)local_b0);
  MetricEdgeLengths<3,_3>::MetricEdgeLengths
            ((MetricEdgeLengths<3,_3> *)&f.lengths.shared_alloc_.direct_ptr,
             (MetricEdgeLengths<3,_3> *)&stack0xffffffffffffff98);
  parallel_for<Omega_h::measure_edges_metric_tmpl<3,3>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>)::_lambda(int)_1_>
            (lengths.shared_alloc_.direct_ptr._4_4_,(type *)local_128,"measure_edges");
  Write<double>::Write(&local_138,(Write<signed_char> *)local_b0);
  Read<double>::Read((Read<double> *)this,&local_138);
  Write<double>::~Write(&local_138);
  measure_edges_metric_tmpl<3,3>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>)::
  {lambda(int)#1}::~Mesh((_lambda_int__1_ *)local_128);
  Write<double>::~Write((Write<double> *)local_b0);
  Read<int>::~Read((Read<int> *)local_98);
  MetricEdgeLengths<3,_3>::~MetricEdgeLengths((MetricEdgeLengths<3,_3> *)&stack0xffffffffffffff98);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals measure_edges_metric_tmpl(Mesh* mesh, LOs a2e, Reals metrics) {
  MetricEdgeLengths<mesh_dim, metric_dim> measurer(mesh, metrics);
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto na = a2e.size();
  Write<Real> lengths(na);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto e = a2e[a];
    auto v = gather_verts<2>(ev2v, e);
    lengths[a] = measurer.measure(v);
  };
  parallel_for(na, f, "measure_edges");
  return lengths;
}